

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

void __thiscall
Lib::
SkipList<Inferences::ALASCA::Demodulation::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator>
::remove<Inferences::ALASCA::Demodulation::Rhs>
          (SkipList<Inferences::ALASCA::Demodulation::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator>
           *this,Rhs key)

{
  long lVar1;
  Comparison CVar2;
  long *in_RDI;
  Node *next;
  uint h;
  Node *left;
  uint foundHeight;
  Node *found;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  Comparison in_stack_ffffffffffffffc4;
  uint local_24;
  long local_20;
  long local_10;
  
  local_24 = (int)in_RDI[1] - 1;
  lVar1 = *in_RDI;
  while( true ) {
    while( true ) {
      while (local_20 = lVar1, lVar1 = *(long *)(local_20 + 0x20 + (ulong)local_24 * 8), lVar1 == 0)
      {
        local_24 = local_24 - 1;
        lVar1 = local_20;
      }
      in_stack_ffffffffffffffc4 =
           Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator::
           compare<Inferences::ALASCA::Demodulation::Rhs>
                     ((Rhs *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (Rhs *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (in_stack_ffffffffffffffc4 != LESS) break;
      local_24 = local_24 - 1;
      lVar1 = local_20;
    }
    if (in_stack_ffffffffffffffc4 == EQUAL) break;
    if (in_stack_ffffffffffffffc4 != GREATER) {
      lVar1 = local_20;
    }
  }
  local_10 = lVar1;
  if ((((local_24 != 0) && (*(long *)(lVar1 + 0x20) != 0)) &&
      (*(long *)(lVar1 + 0x20 + (ulong)local_24 * 8) != *(long *)(lVar1 + 0x20))) &&
     (CVar2 = Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator::
              compare<Inferences::ALASCA::Demodulation::Rhs>
                        ((Rhs *)(ulong)in_stack_ffffffffffffffc0,
                         (Rhs *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
     CVar2 == EQUAL)) {
    local_24 = 0;
    while (*(long *)(lVar1 + 0x20) == *(long *)(lVar1 + 0x20 + (ulong)(local_24 + 1) * 8)) {
      local_24 = local_24 + 1;
    }
    local_10 = *(long *)(lVar1 + 0x20);
    local_20 = lVar1;
  }
  while (*(undefined8 *)(local_20 + 0x20 + (ulong)local_24 * 8) =
              *(undefined8 *)(local_10 + 0x20 + (ulong)local_24 * 8), local_24 != 0) {
    local_24 = local_24 - 1;
    for (; *(long *)(local_20 + 0x20 + (ulong)local_24 * 8) != local_10;
        local_20 = *(long *)(local_20 + 0x20 + (ulong)local_24 * 8)) {
    }
  }
  deallocate((Node *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
  return;
}

Assistant:

void remove(Key key)
  {
    ASS(_top > 0);

    Node* found = 0; // found node
#if VDEBUG
    unsigned foundHeight = 0; // its height
#else
    unsigned foundHeight; // its height
#endif

    Node* left = _left;
    unsigned h = _top-1;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	ASS(h != 0); //this would mean that the value is not present in the list
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  ASS(h != 0);
	  h--;
	  break;

	case GREATER:
	  left = next;
	  break;

	case EQUAL:
	  found = next;
	  foundHeight = h;
	  if(h>0 && found->nodes[0] && found->nodes[h]!=found->nodes[0] &&
		  ValueComparator::compare(key,found->nodes[0]->value)==EQUAL) {
	    //The next element exists, contains the same value,
	    //and its height is lower that the height of this one.
	    //We'll rather delete that one, than the one we've found,
	    //because otherwise there'd be only low elements after a few
	    //deletions, which would degrade the skip list to linked list.
	    h=0;
	    while(found->nodes[0]==found->nodes[h+1]) {
	      h++;
	    }
	    left = found;
	    found = found->nodes[0];
	    foundHeight = h;
	  }
	  for(;;) {
	    left->nodes[h] = found->nodes[h];
	    if(h==0) {
	      break;
	    }
	    h--;
	    while(left->nodes[h]!=found) {
	      left=left->nodes[h];
	      ASS(ValueComparator::compare(key,left->value)!=LESS);
	    }
	  }

	  deallocate(found,foundHeight);
	  return;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }